

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O2

uint crnlib::pixel_format_helpers::get_bpp(pixel_format fmt)

{
  if ((((fmt == PIXEL_FMT_ETC1) || (fmt == PIXEL_FMT_DXT5A)) || (fmt == PIXEL_FMT_DXT1)) ||
     (fmt == PIXEL_FMT_ETC2)) {
    return 4;
  }
  if (((fmt != PIXEL_FMT_3DC) && (fmt != PIXEL_FMT_DXT2)) &&
     ((fmt != PIXEL_FMT_DXT3 && ((fmt != PIXEL_FMT_DXT4 && (fmt != PIXEL_FMT_DXT5)))))) {
    if (fmt == PIXEL_FMT_DXT1A) {
      return 4;
    }
    if (fmt != PIXEL_FMT_L8) {
      if (fmt == PIXEL_FMT_A8R8G8B8) {
        return 0x20;
      }
      if (fmt == PIXEL_FMT_A8L8) {
        return 0x10;
      }
      if ((((fmt != PIXEL_FMT_A8) && (fmt != PIXEL_FMT_DXT5_AGBR)) && (fmt != PIXEL_FMT_DXT5_xGBR))
         && (fmt != PIXEL_FMT_DXT5_xGxR)) {
        if (fmt == PIXEL_FMT_ETC1S) {
          return 4;
        }
        if (((fmt != PIXEL_FMT_ETC2AS) && (fmt != PIXEL_FMT_DXN)) && (fmt != PIXEL_FMT_DXT5_CCxY)) {
          if (fmt == PIXEL_FMT_R8G8B8) {
            return 0x18;
          }
          if (fmt != PIXEL_FMT_ETC2A) {
            return 0;
          }
        }
      }
    }
  }
  return 8;
}

Assistant:

inline uint get_bpp(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_DXT1:
                return 4;
            case PIXEL_FMT_DXT1A:
                return 4;
            case PIXEL_FMT_ETC1:
                return 4;
            case PIXEL_FMT_ETC2:
                return 4;
            case PIXEL_FMT_ETC2A:
                return 8;
            case PIXEL_FMT_ETC1S:
                return 4;
            case PIXEL_FMT_ETC2AS:
                return 8;
            case PIXEL_FMT_DXT2:
                return 8;
            case PIXEL_FMT_DXT3:
                return 8;
            case PIXEL_FMT_DXT4:
                return 8;
            case PIXEL_FMT_DXT5:
                return 8;
            case PIXEL_FMT_3DC:
                return 8;
            case PIXEL_FMT_DXT5A:
                return 4;
            case PIXEL_FMT_R8G8B8:
                return 24;
            case PIXEL_FMT_A8R8G8B8:
                return 32;
            case PIXEL_FMT_A8:
                return 8;
            case PIXEL_FMT_L8:
                return 8;
            case PIXEL_FMT_A8L8:
                return 16;
            case PIXEL_FMT_DXN:
                return 8;
            case PIXEL_FMT_DXT5_CCxY:
                return 8;
            case PIXEL_FMT_DXT5_xGxR:
                return 8;
            case PIXEL_FMT_DXT5_xGBR:
                return 8;
            case PIXEL_FMT_DXT5_AGBR:
                return 8;
            default:
                break;
            }
            CRNLIB_ASSERT(false);
            return 0;
        }